

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::CWriter::Mangle_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool double_underscores)

{
  CWriter ch;
  CWriter *pCVar1;
  bool last_was_underscore;
  State state;
  anon_class_24_3_c371f76a append_escaped;
  bool local_61;
  State local_60;
  uint local_5c;
  string *local_58;
  CWriter *local_50;
  anon_class_24_3_c371f76a local_48;
  
  local_48.state = &local_60;
  local_60 = Any;
  local_48.last_was_underscore = &local_61;
  local_61 = false;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = __return_storage_ptr__;
  if (this != (CWriter *)0x0) {
    local_50 = this + -1;
    pCVar1 = (CWriter *)0x0;
    local_5c = (uint)name._M_str ^ 1;
    local_48.result = __return_storage_ptr__;
    do {
      ch = pCVar1[name._M_len];
      switch(local_60) {
      case Any:
        local_60 = (State)(ch == (CWriter)0x30);
        break;
      case Zero:
        local_60 = (uint)(ch == (CWriter)0x78) * 2;
        break;
      case ZeroX:
        local_60 = (uint)((byte)((char)ch + 0xbfU) < 6) * 3;
        if ((byte)((char)ch - 0x30U) < 10) {
          local_60 = ZeroXHexDigit;
        }
        break;
      case ZeroXHexDigit:
        abort();
      }
      if ((local_60 == ZeroXHexDigit) ||
         ((ch == (CWriter)0x5f &&
          ((local_50 == pCVar1 || pCVar1 == (CWriter *)0x0 || (local_61 == true)))))) {
LAB_0013cd3c:
        anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()(&local_48,(uint8_t)ch)
        ;
      }
      else if (ch == (CWriter)0x5f && (char)local_5c == '\0') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        local_61 = true;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        local_61 = true;
      }
      else {
        if (((ch != (CWriter)0x5f) && (9 < (byte)((char)ch - 0x30U))) &&
           (0x19 < (byte)(((byte)ch & 0xdf) + 0xbf))) goto LAB_0013cd3c;
        std::__cxx11::string::push_back((char)local_58);
        local_61 = ch == (CWriter)0x5f;
      }
      pCVar1 = pCVar1 + 1;
    } while (this != pCVar1);
  }
  return local_58;
}

Assistant:

std::string CWriter::Mangle(std::string_view name, bool double_underscores) {
  /*
   * Name mangling transforms arbitrary Wasm names into "safe" C names
   * in a deterministic way. To avoid collisions, distinct Wasm names must be
   * transformed into distinct C names.
   *
   * The rules implemented here are:
   * 1) any hex digit ('A' through 'F') that follows the sequence "0x"
   *    is escaped
   * 2) any underscore at the beginning, at the end, or following another
   *    underscore, is escaped
   * 3) if double_underscores is set, underscores are replaced with
   *    two underscores.
   * 4) otherwise, any alphanumeric character is kept as-is,
   *    and any other character is escaped
   *
   * "Escaped" means the character is represented with the sequence "0xAB",
   * where A B are hex digits ('0'-'9' or 'A'-'F') representing the character's
   * numeric value.
   *
   * Module names are mangled with double_underscores=true to prevent
   * collisions between, e.g., a module "alfa" with export
   * "bravo_charlie" vs. a module "alfa_bravo" with export "charlie".
   */

  enum State { Any, Zero, ZeroX, ZeroXHexDigit } state{Any};
  bool last_was_underscore = false;

  std::string result;
  auto append_escaped = [&](const uint8_t ch) {
    result += "0x" + StringPrintf("%02X", ch);
    last_was_underscore = false;
    state = Any;
  };

  auto append_verbatim = [&](const uint8_t ch) {
    result += ch;
    last_was_underscore = (ch == '_');
  };

  for (auto it = name.begin(); it != name.end(); ++it) {
    const uint8_t ch = *it;
    switch (state) {
      case Any:
        state = (ch == '0') ? Zero : Any;
        break;
      case Zero:
        state = (ch == 'x') ? ZeroX : Any;
        break;
      case ZeroX:
        state = internal_ishexdigit(ch) ? ZeroXHexDigit : Any;
        break;
      case ZeroXHexDigit:
        WABT_UNREACHABLE;
        break;
    }

    /* rule 1 */
    if (state == ZeroXHexDigit) {
      append_escaped(ch);
      continue;
    }

    /* rule 2 */
    if ((ch == '_') && ((it == name.begin()) || (std::next(it) == name.end()) ||
                        last_was_underscore)) {
      append_escaped(ch);
      continue;
    }

    /* rule 3 */
    if (double_underscores && ch == '_') {
      append_verbatim(ch);
      append_verbatim(ch);
      continue;
    }

    /* rule 4 */
    if (internal_isalnum(ch) || (ch == '_')) {
      append_verbatim(ch);
    } else {
      append_escaped(ch);
    }
  }

  return result;
}